

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::DeepTiledInputFile::Data::readTiles
          (Data *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly,bool countsOnly)

{
  int iVar1;
  TileProcess *__dest;
  TileProcess *pTVar2;
  atomic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*> aVar3;
  atomic<Imf_3_4::(anonymous_namespace)::TileProcess_*> aVar4;
  int iVar5;
  TileProcess *pTVar6;
  Task *this_00;
  atomic<Imf_3_4::(anonymous_namespace)::TileProcess_*> aVar7;
  ostream *poVar8;
  InputExc *pIVar9;
  IoExc *this_01;
  undefined4 in_register_0000000c;
  int iVar10;
  TileProcess *__cur_1;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  TileProcess *__cur;
  TileProcess *pTVar14;
  __base_type _Var15;
  bool bVar16;
  TaskGroup tg;
  exr_chunk_info_t cinfo;
  TileProcessGroup tpg;
  stringstream _iex_throw_s;
  ulong local_478;
  TaskGroup local_450 [8];
  ulong local_448;
  exr_chunk_info_t local_440;
  undefined1 local_400 [40];
  __base_type local_3d8;
  TileProcess *pTStack_3d0;
  TileProcess *local_3c8;
  atomic<Imf_3_4::(anonymous_namespace)::TileProcess_*> aStack_3c0;
  atomic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_3b8;
  undefined1 local_278 [16];
  undefined8 auStack_268 [2];
  uint64_t uStack_258;
  uint64_t local_250;
  uint64_t uStack_248;
  uint64_t local_240;
  uint64_t uStack_238;
  
  local_478 = CONCAT44(in_register_0000000c,dy1);
  if (1 < ((dy2 - dy1) + 1) * ((dx2 - dx1) + 1)) {
    uVar11 = (ulong)this->numThreads;
    if (1 < (long)uVar11) {
      IlmThread_3_4::Semaphore::Semaphore((Semaphore *)local_400,this->numThreads);
      local_3d8._M_p = (TileProcess *)0x0;
      pTStack_3d0 = (TileProcess *)0x0;
      local_3c8 = (TileProcess *)0x0;
      aStack_3c0._M_b._M_p = (__base_type)(__pointer_type)0x0;
      local_3b8._M_b._M_p = (__base_type)(__pointer_type)0x0;
      pTVar6 = (TileProcess *)0x0;
      lVar12 = -uVar11;
      pTVar14 = pTStack_3d0;
      if ((uVar11 != 0) && (uVar11 != 0)) {
        if (uVar11 == 0) {
          do {
            memset(pTVar6,0,0x248);
            pTVar6->last_decode_err = 0x21;
            pTVar6->first = true;
            pTVar6->counts_only = false;
            pTVar6 = pTVar6 + 1;
            lVar12 = lVar12 + 1;
            pTVar14 = pTVar6;
          } while (lVar12 != 0);
        }
        else {
          if (0x381c0e070381c0 < uVar11) {
            std::__throw_length_error("vector::_M_default_append");
          }
          uVar13 = uVar11;
          if (0x381c0e070381bf < uVar11) {
            uVar13 = 0x381c0e070381c0;
          }
          if (uVar13 == 0) {
            pTVar6 = (TileProcess *)0x0;
          }
          else {
            pTVar6 = (TileProcess *)operator_new(uVar13 * 0x248);
          }
          lVar12 = -uVar11;
          pTVar14 = pTVar6;
          local_448 = uVar11;
          do {
            memset(pTVar14,0,0x248);
            pTVar2 = pTStack_3d0;
            pTVar14->last_decode_err = 0x21;
            pTVar14->first = true;
            pTVar14->counts_only = false;
            pTVar14 = pTVar14 + 1;
            lVar12 = lVar12 + 1;
            __dest = pTVar6;
            _Var15._M_p = local_3d8._M_p;
          } while (lVar12 != 0);
          for (; _Var15._M_p != pTVar2; _Var15._M_p = _Var15._M_p + 1) {
            memcpy(__dest,_Var15._M_p,0x248);
            anon_unknown_14::TileProcess::~TileProcess(_Var15._M_p);
            __dest = __dest + 1;
          }
          if (local_3d8._M_p != (TileProcess *)0x0) {
            operator_delete(local_3d8._M_p,(long)local_3c8 - (long)local_3d8._M_p);
          }
          local_3c8 = pTVar6 + uVar13;
          uVar11 = local_448;
          local_3d8._M_p = pTVar6;
          pTVar14 = pTVar6 + local_448;
        }
      }
      pTStack_3d0 = pTVar14;
      uVar13 = 0;
      _Var15._M_p = local_3d8._M_p;
      do {
        pTVar6 = (TileProcess *)0x0;
        if ((int)uVar11 - 1 != uVar13) {
          pTVar6 = _Var15._M_p + 1;
        }
        (_Var15._M_p)->next = pTVar6;
        uVar13 = uVar13 + 1;
        _Var15._M_p = _Var15._M_p + 1;
      } while (uVar11 != uVar13);
      LOCK();
      aStack_3c0._M_b._M_p = (__base_type)(__base_type)local_3d8._M_p;
      UNLOCK();
      IlmThread_3_4::TaskGroup::TaskGroup(local_450);
      if (dy1 <= dy2) {
        do {
          iVar1 = (int)local_478;
          iVar10 = dx1;
          if (dx1 <= dx2) {
            do {
              iVar5 = exr_read_tile_chunk_info
                                (*(this->_ctxt->_ctxt).
                                  super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,this->partNumber,iVar10,local_478,lx,ly,&local_440);
              if (iVar5 != 0) {
                if (iVar5 != 0x18) {
                  pIVar9 = (InputExc *)__cxa_allocate_exception(0x48);
                  Iex_3_4::InputExc::InputExc(pIVar9,"Unable to query tile information");
                  __cxa_throw(pIVar9,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
                }
                iex_debugTrap();
                std::__cxx11::stringstream::stringstream((stringstream *)local_278);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)auStack_268,"Tile (",6);
                poVar8 = (ostream *)std::ostream::operator<<((ostream *)auStack_268,iVar10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
                poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
                poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,lx);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
                poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,ly);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,") is missing.",0xd);
                pIVar9 = (InputExc *)__cxa_allocate_exception(0x48);
                Iex_3_4::InputExc::InputExc(pIVar9,(stringstream *)local_278);
                __cxa_throw(pIVar9,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
              }
              this_00 = (Task *)operator_new(0x30);
              IlmThread_3_4::Task::Task(this_00,local_450);
              *(undefined ***)this_00 = &PTR__TileBufferTask_001e5260;
              *(DeepFrameBuffer **)(this_00 + 0x10) = &this->frameBuffer;
              *(Data **)(this_00 + 0x18) = this;
              IlmThread_3_4::Semaphore::wait();
              aVar7._M_b._M_p = aStack_3c0._M_b._M_p;
              do {
                _Var15 = aVar7._M_b._M_p;
                if (_Var15._M_p == (TileProcess *)0x0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"GACK: serious failure case???",0x1d);
                  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
                  std::ostream::put(' ');
                  std::ostream::flush();
                }
                LOCK();
                bVar16 = (__base_type)_Var15._M_p != aStack_3c0._M_b._M_p;
                aVar7._M_b._M_p = (__base_type)(__base_type)_Var15._M_p;
                aVar4._M_b._M_p = (__base_type)(__base_type)(_Var15._M_p)->next;
                if (bVar16) {
                  aVar7._M_b._M_p = aStack_3c0._M_b._M_p;
                  aVar4._M_b._M_p = aStack_3c0._M_b._M_p;
                }
                aStack_3c0._M_b._M_p = aVar4._M_b._M_p;
                UNLOCK();
              } while (bVar16);
              *(__pointer_type *)(this_00 + 0x20) = _Var15._M_p;
              *(undefined1 **)(this_00 + 0x28) = local_400;
              ((_Var15._M_p)->cinfo).sample_count_data_offset = local_440.sample_count_data_offset;
              ((_Var15._M_p)->cinfo).sample_count_table_size = local_440.sample_count_table_size;
              ((_Var15._M_p)->cinfo).packed_size = local_440.packed_size;
              ((_Var15._M_p)->cinfo).unpacked_size = local_440.unpacked_size;
              ((_Var15._M_p)->cinfo).width = local_440.width;
              ((_Var15._M_p)->cinfo).level_x = local_440.level_x;
              ((_Var15._M_p)->cinfo).level_y = local_440.level_y;
              ((_Var15._M_p)->cinfo).type = local_440.type;
              ((_Var15._M_p)->cinfo).compression = local_440.compression;
              ((_Var15._M_p)->cinfo).data_offset = local_440.data_offset;
              ((_Var15._M_p)->cinfo).idx = local_440.idx;
              ((_Var15._M_p)->cinfo).start_x = local_440.start_x;
              ((_Var15._M_p)->cinfo).start_y = local_440.start_y;
              ((_Var15._M_p)->cinfo).height = local_440.height;
              (_Var15._M_p)->counts_only = countsOnly;
              IlmThread_3_4::ThreadPool::addGlobalTask(this_00);
              bVar16 = iVar10 != dx2;
              iVar10 = iVar10 + 1;
            } while (bVar16);
          }
          local_478 = (ulong)(iVar1 + 1);
        } while (iVar1 != dy2);
      }
      IlmThread_3_4::TaskGroup::~TaskGroup(local_450);
      aVar3._M_b._M_p = local_3b8._M_b._M_p;
      LOCK();
      local_3b8._M_b._M_p = (__base_type)(__pointer_type)0x0;
      UNLOCK();
      if (aVar3._M_b._M_p == (__pointer_type)0x0) {
        IlmThread_3_4::ProcessGroup<Imf_3_4::(anonymous_namespace)::TileProcess,_true>::
        ~ProcessGroup((ProcessGroup<Imf_3_4::(anonymous_namespace)::TileProcess,_true> *)local_400);
        return;
      }
      local_278._0_8_ = auStack_268;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_278,*(long *)aVar3._M_b._M_p,
                 *(size_type *)((long)aVar3._M_b._M_p + 8) + *(long *)aVar3._M_b._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*(long **)aVar3._M_b._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)aVar3._M_b._M_p + 0x10)) {
        operator_delete(*(long **)aVar3._M_b._M_p,
                        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)((long)aVar3._M_b._M_p + 0x10))->_M_allocated_capacity + 1);
      }
      operator_delete((void *)aVar3._M_b._M_p,0x20);
      this_01 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::IoExc::IoExc(this_01,(string *)local_278);
      __cxa_throw(this_01,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
    }
  }
  local_278[5] = countsOnly;
  local_278._0_5_ = 0x100000021;
  if (dy1 <= dy2) {
    do {
      iVar1 = (int)local_478;
      iVar10 = dx1;
      if (dx1 <= dx2) {
        do {
          iVar5 = exr_read_tile_chunk_info
                            (*(this->_ctxt->_ctxt).
                              super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,this->partNumber,iVar10,local_478,lx,ly,&local_440);
          if (iVar5 != 0) {
            if (iVar5 != 0x18) {
              pIVar9 = (InputExc *)__cxa_allocate_exception(0x48);
              Iex_3_4::InputExc::InputExc(pIVar9,"Unable to query tile information");
              __cxa_throw(pIVar9,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
            }
            iex_debugTrap();
            std::__cxx11::stringstream::stringstream((stringstream *)local_400);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_400 + 0x10),"Tile (",6);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)(local_400 + 0x10),iVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,lx);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,ly);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,") is missing.",0xd);
            pIVar9 = (InputExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::InputExc::InputExc(pIVar9,(stringstream *)local_400);
            __cxa_throw(pIVar9,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
          }
          local_240 = local_440.sample_count_data_offset;
          uStack_238 = local_440.sample_count_table_size;
          local_250 = local_440.packed_size;
          uStack_248 = local_440.unpacked_size;
          auStack_268[1]._0_4_ = local_440.width;
          auStack_268[1]._4_1_ = local_440.level_x;
          auStack_268[1]._5_1_ = local_440.level_y;
          auStack_268[1]._6_1_ = local_440.type;
          auStack_268[1]._7_1_ = local_440.compression;
          uStack_258 = local_440.data_offset;
          local_278._8_4_ = local_440.idx;
          local_278._12_4_ = local_440.start_x;
          auStack_268[0]._0_4_ = local_440.start_y;
          auStack_268[0]._4_4_ = local_440.height;
          anon_unknown_14::TileProcess::run_decode
                    ((TileProcess *)local_278,
                     *(this->_ctxt->_ctxt).
                      super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     this->partNumber,&this->frameBuffer,&this->fill_list);
          iVar10 = iVar10 + 1;
        } while (dx2 + 1 != iVar10);
      }
      local_478 = (ulong)(iVar1 + 1);
    } while (iVar1 != dy2);
  }
  anon_unknown_14::TileProcess::~TileProcess((TileProcess *)local_278);
  return;
}

Assistant:

void DeepTiledInputFile::Data::readTiles (
    int dx1, int dx2, int dy1, int dy2, int lx, int ly, bool countsOnly)
{
    int nTiles = dx2 - dx1 + 1;
    nTiles *= dy2 - dy1 + 1;

    exr_chunk_info_t      cinfo;
#if ILMTHREAD_THREADING_ENABLED
    if (nTiles > 1 && numThreads > 1)
    {
        // we need the lifetime of this to last longer than the
        // lifetime of the task group below such that we don't get use
        // after free type error, so use scope rules to accomplish
        // this
        TileProcessGroup tpg (numThreads);

        {
            ILMTHREAD_NAMESPACE::TaskGroup tg;

            for (int ty = dy1; ty <= dy2; ++ty)
            {
                for (int tx = dx1; tx <= dx2; ++tx)
                {
                    exr_result_t rv = exr_read_tile_chunk_info (
                        *_ctxt, partNumber, tx, ty, lx, ly, &cinfo);
                    if (EXR_ERR_INCOMPLETE_CHUNK_TABLE == rv)
                    {
                        THROW (
                            IEX_NAMESPACE::InputExc,
                            "Tile (" << tx << ", " << ty << ", " << lx << ", " << ly
                            << ") is missing.");
                    }
                    else if (EXR_ERR_SUCCESS != rv)
                        throw IEX_NAMESPACE::InputExc ("Unable to query tile information");

                    ILMTHREAD_NAMESPACE::ThreadPool::addGlobalTask (
                        new TileBufferTask (&tg, this, &tpg, &frameBuffer, cinfo, countsOnly) );
                }
            }
        }

        tpg.throw_on_failure ();
    }
    else
#endif
    {
        TileProcess tp;

        tp.counts_only = countsOnly;
        for (int ty = dy1; ty <= dy2; ++ty)
        {
            for (int tx = dx1; tx <= dx2; ++tx)
            {
                exr_result_t rv = exr_read_tile_chunk_info (
                    *_ctxt, partNumber, tx, ty, lx, ly, &cinfo);
                if (EXR_ERR_INCOMPLETE_CHUNK_TABLE == rv)
                {
                    THROW (
                        IEX_NAMESPACE::InputExc,
                        "Tile (" << tx << ", " << ty << ", " << lx << ", " << ly
                        << ") is missing.");
                }
                else if (EXR_ERR_SUCCESS != rv)
                    throw IEX_NAMESPACE::InputExc ("Unable to query tile information");

                tp.cinfo = cinfo;
                tp.run_decode (
                    *_ctxt,
                    partNumber,
                    &frameBuffer,
                    fill_list);
            }
        }
    }
}